

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O0

TermList Shell::AnswerLiteralManager::possiblyEvaluateAnswerTerm(TermList aT)

{
  initializer_list<Kernel::TermList> sorts;
  bool bVar1;
  uint uVar2;
  Term *pTVar3;
  InterpretedLiteralEvaluator *this;
  TermList *this_00;
  Literal *in_RDI;
  char *in_stack_00000018;
  char *in_stack_00000020;
  uint in_stack_0000002c;
  Signature *in_stack_00000030;
  bool litMod;
  bool constTrue;
  bool constant;
  Literal *res;
  Literal *l;
  OperatorType *type;
  TermList sort;
  uint p;
  InterpretedLiteralEvaluator eval;
  OperatorType *in_stack_fffffffffffffee8;
  Signature *in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffefb;
  uint in_stack_fffffffffffffefc;
  TermList in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff10;
  uint taArity;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar4;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined2 in_stack_ffffffffffffff36;
  Literal *lit;
  uint64_t local_b0;
  uint64_t *local_a8;
  undefined8 local_a0;
  Term *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffffcf;
  InterpretedLiteralEvaluator *in_stack_ffffffffffffffd0;
  
  taArity = (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  bVar1 = Kernel::TermList::isTerm((TermList *)0xb7b1ec);
  if (bVar1) {
    Kernel::TermList::term((TermList *)0xb7b202);
    bVar1 = Kernel::Term::isSpecial((Term *)0xb7b20a);
    if (!bVar1) {
      uVar4 = 1;
      Kernel::InterpretedLiteralEvaluator::InterpretedLiteralEvaluator
                (in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
      uVar2 = Kernel::Signature::addFreshPredicate
                        (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_00000018);
      pTVar3 = Kernel::TermList::term((TermList *)0xb7b265);
      local_b0 = (uint64_t)Kernel::SortHelper::getResultSort(in_stack_ffffffffffffff68);
      local_a8 = &local_b0;
      local_a0 = 1;
      sorts._M_len = (size_type)pTVar3;
      sorts._M_array = (iterator)local_b0;
      Kernel::OperatorType::getPredicateType(sorts,taArity);
      Kernel::Signature::getPredicate
                (in_stack_fffffffffffffef0,(uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      Kernel::Signature::Symbol::setType
                ((Symbol *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      lit = in_RDI;
      this = (InterpretedLiteralEvaluator *)
             Kernel::Literal::create1
                       (in_stack_fffffffffffffefc,(bool)in_stack_fffffffffffffefb,
                        in_stack_ffffffffffffff00);
      pTVar3 = (Term *)0x0;
      bVar1 = Kernel::InterpretedLiteralEvaluator::evaluate
                        (this,lit,(bool *)0x0,
                         (Literal **)
                         CONCAT26(in_stack_ffffffffffffff36,
                                  CONCAT15(in_stack_ffffffffffffff35,
                                           CONCAT14(in_stack_ffffffffffffff34,uVar2))),
                         (bool *)CONCAT44(uVar4,in_stack_ffffffffffffff28));
      if ((bVar1) && (pTVar3 != (Term *)0x0)) {
        this_00 = Kernel::Term::nthArgument(pTVar3,0);
        pTVar3 = Kernel::TermList::term((TermList *)0xb7b39b);
        Kernel::TermList::setTerm(this_00,pTVar3);
      }
      Kernel::InterpretedLiteralEvaluator::~InterpretedLiteralEvaluator(this);
    }
  }
  return (TermList)(uint64_t)in_RDI;
}

Assistant:

TermList AnswerLiteralManager::possiblyEvaluateAnswerTerm(TermList aT)
{
  if(aT.isTerm() && !aT.term()->isSpecial()){
    InterpretedLiteralEvaluator eval;
    unsigned p = env.signature->addFreshPredicate(1,"p");
    TermList sort = SortHelper::getResultSort(aT.term());
    OperatorType* type = OperatorType::getPredicateType({sort});
    env.signature->getPredicate(p)->setType(type);
    Literal* l = Literal::create1(p,true,aT);
    Literal* res =0;
    bool constant, constTrue;
    bool litMod = eval.evaluate(l,constant,res,constTrue);
    if(litMod && res){
      aT.setTerm(res->nthArgument(0)->term());
    }
  }
  return aT;
}